

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

bool __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,void *data)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  MessageBuilder *this_01;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int *value;
  GLint expected_value;
  undefined1 local_1b0 [384];
  
  iVar2 = (this->m_n_available_vectors * 4 + 1) * this->m_n_available_vectors * 4 >> 1;
  uVar3 = 0;
  do {
    if (uVar3 == 2) {
LAB_00cebeba:
      return 1 < uVar3;
    }
    value = (int *)data;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      if (*value != iVar2) {
        local_1b0._0_8_ =
             ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Wrong result! Expected: ");
        std::ostream::operator<<(this_00,iVar2);
        std::operator<<((ostream *)this_00," Extracted: ");
        this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        poVar1 = &this_01->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"  X: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," Y: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_00cebeba;
      }
      value = value + 4;
    }
    uVar3 = uVar3 + 1;
    data = (void *)((long)data + 0x20);
  } while( true );
}

Assistant:

bool GeometryShaderMaxOutputComponentsSinglePointTest::verifyResult(const void* data)
{
	const unsigned char* result_image			= (const unsigned char*)data;
	const unsigned int   line_size				= m_texture_width * m_texture_pixel_size;
	const glw::GLint	 n_components_per_point = m_n_available_vectors * 4; /* 4 components per vector */

	const glw::GLint first_value	= 1;
	const glw::GLint last_value		= n_components_per_point;
	const glw::GLint expected_value = ((first_value + last_value) * n_components_per_point) / 2;

	/* Verify all pixels that belong to point, area m_point_size x m_point_size */
	for (unsigned int y = 0; y < m_point_size; ++y)
	{
		const unsigned int line_offset = y * line_size;

		for (unsigned int x = 0; x < m_point_size; ++x)
		{
			const unsigned int texel_offset = line_offset + x * m_texture_pixel_size;

			if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
			{
				const glw::GLint* result_value = (const glw::GLint*)(result_image + texel_offset);

				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! Expected: " << expected_value
								   << " Extracted: " << *result_value << "  X: " << x << " Y: " << y
								   << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}